

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

nng_err nni_http_server_start(nni_http_server *s)

{
  int iVar1;
  nng_err nVar2;
  undefined8 in_RAX;
  uint32_t local_24;
  
  local_24 = (uint32_t)((ulong)in_RAX >> 0x20);
  nni_mtx_lock(&s->mtx);
  iVar1 = s->starts;
  if (iVar1 == 0) {
    nVar2 = nng_stream_listener_listen(s->listener);
    if (nVar2 != NNG_OK) goto LAB_00138fda;
    if (s->port == 0) {
      nng_stream_listener_get_int(s->listener,"tcp-bound-port",(int *)&local_24);
      s->port = local_24;
    }
    nng_stream_listener_accept(s->listener,&s->accaio);
    iVar1 = s->starts;
  }
  s->starts = iVar1 + 1;
  nVar2 = NNG_OK;
LAB_00138fda:
  nni_mtx_unlock(&s->mtx);
  return nVar2;
}

Assistant:

static nng_err
http_server_start(nni_http_server *s)
{
	nng_err rv;
	if ((rv = nng_stream_listener_listen(s->listener)) != 0) {
		return (rv);
	}
	if (s->port == 0) {
		int port;
		nng_stream_listener_get_int(
		    s->listener, NNG_OPT_TCP_BOUND_PORT, &port);
		s->port = (uint32_t) port;
	}
	nng_stream_listener_accept(s->listener, &s->accaio);
	return (NNG_OK);
}